

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_readwrite.c
# Opt level: O1

void canvas_collecttemplatesfor(_glist *x,int *ntemplatesp,t_symbol ***templatevecp,int wholething)

{
  _glist *x_00;
  t_pd p_Var1;
  t_symbol ***ppptVar2;
  
  ppptVar2 = (t_symbol ***)(ulong)(uint)wholething;
  for (x_00 = (_glist *)x->gl_list; x_00 != (_glist *)0x0;
      x_00 = (_glist *)(x_00->gl_obj).te_g.g_next) {
    p_Var1 = (x_00->gl_obj).te_g.g_pd;
    if (p_Var1 == scalar_class) {
      ppptVar2 = templatevecp;
      canvas_addtemplatesforscalar
                ((t_symbol *)(x_00->gl_obj).te_binbuf,(t_word *)&(x_00->gl_obj).te_outlet,
                 ntemplatesp,templatevecp);
    }
    else if (p_Var1 == canvas_class) {
      canvas_collecttemplatesfor(x_00,ntemplatesp,templatevecp,(int)ppptVar2);
    }
  }
  return;
}

Assistant:

static void canvas_collecttemplatesfor(t_canvas *x, int *ntemplatesp,
    t_symbol ***templatevecp, int wholething)
{
    t_gobj *y;

    for (y = x->gl_list; y; y = y->g_next)
    {
        if ((pd_class(&y->g_pd) == scalar_class) &&
            (wholething || glist_isselected(x, y)))
                canvas_addtemplatesforscalar(((t_scalar *)y)->sc_template,
                    ((t_scalar *)y)->sc_vec,  ntemplatesp, templatevecp);
        else if ((pd_class(&y->g_pd) == canvas_class) &&
            (wholething || glist_isselected(x, y)))
                canvas_collecttemplatesfor((t_canvas *)y,
                    ntemplatesp, templatevecp, 1);
    }
}